

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O3

void snestistics::asm_writer
               (ReportWriter *report,Options *options,Trace *trace,AnnotationResolver *annotations,
               RomAccessor *rom_accessor)

{
  LargeBitfield *labels;
  _Rb_tree_header *p_Var1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  _Rb_tree_color p;
  FILE *__s;
  pointer pAVar6;
  char *pcVar7;
  pointer pDVar8;
  undefined3 uVar9;
  Pointer PVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  size_type sVar15;
  FILE *__stream;
  char cVar16;
  _Base_ptr p_Var17;
  bool bVar18;
  byte bVar19;
  byte bVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  ushort uVar23;
  int iVar24;
  int iVar25;
  uint32_t numBytesUsed;
  ushort *puVar26;
  size_t sVar27;
  byte *data;
  mapped_type *pmVar28;
  ulong uVar29;
  pointer pOVar30;
  _Rb_tree_node_base *p_Var31;
  long lVar32;
  _Rb_tree_node_base *p_Var33;
  int iVar34;
  _Rb_tree_color _Var35;
  string *psVar36;
  byte bVar37;
  int iVar38;
  ulong uVar39;
  _Base_ptr p_Var40;
  uint uVar41;
  Annotation *a;
  pointer pAVar42;
  uint uVar43;
  uint uVar44;
  pointer pOVar45;
  size_type_conflict __new_size;
  uint3 uVar46;
  _Alloc_hider _Var47;
  uint3 uVar48;
  ulong uVar49;
  _Base_ptr *p_00;
  _Base_ptr p_Var50;
  _Base_ptr p_Var51;
  uint uVar52;
  _Rb_tree_color _Var53;
  vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_> *__range1;
  uint uVar55;
  uint3 uVar54;
  uint uVar56;
  Annotation *a_1;
  ulong uVar57;
  pointer pOVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  int local_3310;
  int local_330c;
  int local_3304;
  vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_> *__range1_1;
  vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> variants;
  int numBitsNeeded;
  Trace *local_32b8;
  uint local_32b0;
  uint local_32ac;
  uint local_32a8;
  uint local_32a4;
  string use_comment_1;
  AsmWriteWLADX writer;
  Proposals proposals;
  string name_2;
  string line_comment;
  string local_3190;
  ulong local_3170;
  _Rb_tree_node_base *local_3168;
  anon_class_24_3_79b0c3fc variant_writer;
  char target_1 [128];
  char target_label [128];
  string line_comment_1;
  int local_2048;
  string line_use_comment;
  int local_1040;
  Array<unsigned_char> header;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1028 [255];
  int local_38;
  
  writer.m_nextPC = 0xffffffff;
  writer.m_bankOpen = false;
  writer.m_sectionCounter = 0;
  __s = (FILE *)report->report;
  pAVar42 = (annotations->_annotations).
            super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pAVar6 = (annotations->_annotations).
           super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_32b8 = trace;
  writer.m_options = options;
  writer.m_romData = rom_accessor;
  writer.m_outFile = (FILE *)__s;
  writer.m_report = report;
  if (pAVar42 != pAVar6) {
    do {
      if ((pAVar42->type == ANNOTATION_FUNCTION) ||
         ((pAVar42->type == ANNOTATION_LINE && ((pAVar42->name)._M_string_length != 0)))) {
        LargeBitfield::set_bit(&trace->labels,pAVar42->startOfRange,true);
      }
      pAVar42 = pAVar42 + 1;
    } while (pAVar42 != pAVar6);
  }
  ReportWriter::writeSeperator(report,"Header");
  if ((options->asm_header_file)._M_string_length != 0) {
    header._data = (uchar *)0x0;
    header._8_8_ = header._8_8_ & 0xffffffff00000000;
    read_file(&options->asm_header_file,&header);
    if ((header._8_8_ & 0xffffffff) == 0) {
      __assert_fail("index<_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/utils.h"
                    ,0x129,
                    "T &snestistics::Array<unsigned char>::operator[](const uint64_t) [T = unsigned char]"
                   );
    }
    fwrite(header._data,header._8_8_ & 0xffffffff,1,(FILE *)report->report);
    fputc(10,(FILE *)report->report);
    if (header._data != (uchar *)0x0) {
      operator_delete__(header._data);
    }
  }
  fwrite(".SNESNATIVEVECTOR      ; Define Native Mode interrupt vector table\n",0x43,1,__s);
  puVar26 = (ushort *)RomAccessor::evalPtr(rom_accessor,0xffe4);
  labels = &local_32b8->labels;
  uVar23 = *puVar26;
  if ((labels->_state[uVar23 >> 5] >> (uVar23 & 0x1f) & 1) != 0) {
    AnnotationResolver::label((string *)&header,annotations,(uint)uVar23,(string *)0x0,true);
    if (header._8_8_ != 0) {
      fprintf(__s,"  %-6s %s\n","COP");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)header._data != local_1028) {
        operator_delete(header._data);
      }
      goto LAB_00126d84;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)header._data != local_1028) {
      operator_delete(header._data);
    }
  }
  fprintf(__s,"  %-6s $%04X\n","COP",(ulong)(uint)uVar23);
LAB_00126d84:
  anon_unknown.dwarf_18c9a::AsmWriteWLADX::write_vector_single
            (&writer,"BRK",annotations,labels,0xffe6);
  anon_unknown.dwarf_18c9a::AsmWriteWLADX::write_vector_single
            (&writer,"ABORT",annotations,labels,0xffe8);
  anon_unknown.dwarf_18c9a::AsmWriteWLADX::write_vector_single
            (&writer,"NMI",annotations,labels,0xffea);
  anon_unknown.dwarf_18c9a::AsmWriteWLADX::write_vector_single
            (&writer,"IRQ",annotations,labels,0xffee);
  fwrite(".ENDNATIVEVECTOR\n",0x11,1,__s);
  fwrite("\n.SNESEMUVECTOR         ; Define Emulation Mode interrupt vector table\n",0x47,1,__s);
  anon_unknown.dwarf_18c9a::AsmWriteWLADX::write_vector_single
            (&writer,"COP",annotations,labels,0xfff4);
  anon_unknown.dwarf_18c9a::AsmWriteWLADX::write_vector_single
            (&writer,"ABORT",annotations,labels,0xfff8);
  anon_unknown.dwarf_18c9a::AsmWriteWLADX::write_vector_single
            (&writer,"NMI",annotations,labels,0xfffa);
  anon_unknown.dwarf_18c9a::AsmWriteWLADX::write_vector_single
            (&writer,"RESET",annotations,labels,0xfffc);
  anon_unknown.dwarf_18c9a::AsmWriteWLADX::write_vector_single
            (&writer,"IRQBRK",annotations,labels,0xfffe);
  fwrite(".ENDEMUVECTOR\n",0xe,1,__s);
  ReportWriter::writeSeperator(report,"Data");
  pAVar42 = (annotations->_annotations).
            super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pAVar6 = (annotations->_annotations).
           super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar42 != pAVar6) {
    do {
      if (pAVar42->type == ANNOTATION_DATA) {
        sprintf((char *)&header,"$%04X",(ulong)(ushort)pAVar42->startOfRange);
        line_comment_1._M_dataplus._M_p = (pointer)&line_comment_1.field_2;
        sVar27 = strlen((char *)&header);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&line_comment_1,&header,(long)local_1028 + (sVar27 - 0x10));
        psVar36 = &pAVar42->comment;
        if ((pAVar42->comment)._M_string_length == 0) {
          psVar36 = &pAVar42->useComment;
        }
        iVar24 = fprintf(__s,".EQU %s %s",(pAVar42->name)._M_dataplus._M_p,
                         line_comment_1._M_dataplus._M_p);
        iVar25 = 0x48;
        if (0x48 < iVar24) {
          iVar25 = iVar24;
        }
        anon_unknown.dwarf_18c9a::AsmWriteWLADX::writeCommentHelper
                  (&writer,iVar24,(iVar25 - 0x45U & 0xfffffffc) + 0x48,psVar36);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line_comment_1._M_dataplus._M_p != &line_comment_1.field_2) {
          operator_delete(line_comment_1._M_dataplus._M_p);
        }
      }
      pAVar42 = pAVar42 + 1;
    } while (pAVar42 != pAVar6);
  }
  ReportWriter::writeSeperator(report,"Code");
  variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::reserve(&variants,0x10000)
  ;
  p_Var33 = (local_32b8->ops)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3168 = &(local_32b8->ops)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var33 != local_3168) {
    _Var53 = ~_S_red;
    do {
      p = p_Var33[1]._M_color;
      if (_Var53 == ~_S_red) {
        _Var53 = p;
      }
      if (p < _Var53) {
        bVar18 = false;
      }
      else {
        bVar18 = false;
        do {
          if ((labels->_state[_Var53 >> 5] >> (_Var53 & 0x1f) & 1) != 0) {
            header._data = (uchar *)local_1028;
            header._size = 0;
            header._12_4_ = 0;
            local_1028[0]._M_local_buf[0] = '\0';
            line_comment_1._M_dataplus._M_p = (pointer)&line_comment_1.field_2;
            line_comment_1._M_string_length = 0;
            line_comment_1.field_2._M_local_buf[0] = '\0';
            line_use_comment._M_string_length = 0;
            line_use_comment.field_2._M_local_buf[0] = '\0';
            line_use_comment._M_dataplus._M_p = (pointer)&line_use_comment.field_2;
            AnnotationResolver::line_info
                      (annotations,_Var53,(string *)&header,&line_comment_1,&line_use_comment,true);
            target_1._0_8_ = target_1 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)target_1,line_comment_1._M_dataplus._M_p,
                       line_comment_1._M_dataplus._M_p + line_comment_1._M_string_length);
            if (line_comment_1._M_string_length == 0) {
              std::__cxx11::string::_M_assign((string *)target_1);
            }
            target_label._0_8_ = target_label + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)target_label,target_1._0_8_,target_1._8_8_ + target_1._0_8_);
            proposals._M_t._M_impl._0_8_ =
                 &proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            std::__cxx11::string::_M_construct<char_const*>((string *)&proposals,"");
            anon_unknown.dwarf_18c9a::AsmWriteWLADX::prepareWrite(&writer,_Var53,true);
            __stream = writer.m_outFile;
            fputc(10,(FILE *)writer.m_outFile);
            if (target_label._8_8_ != 0) {
              anon_unknown.dwarf_18c9a::AsmWriteWLADX::writeCommentHelper
                        (&writer,0,0,(string *)target_label);
            }
            iVar25 = fprintf((FILE *)__stream,"%s:",header._data);
            if (CONCAT44(proposals._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                         proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_color) != 0) {
              iVar24 = 0x48;
              if (0x48 < iVar25) {
                iVar24 = iVar25;
              }
              iVar24 = (iVar24 - 0x45U & 0xfffffffc) + 0x48;
              iVar34 = iVar24 - iVar25;
              if (iVar24 < iVar25) {
                __assert_fail("target >= pos",
                              "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                              ,0xf2,
                              "int (anonymous namespace)::AsmWriteWLADX::indent_column(FILE *, int, int, bool)"
                             );
              }
              if (0x9f < iVar34) {
                __assert_fail("wanted_spaces <= 159",
                              "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                              ,0xf4,
                              "int (anonymous namespace)::AsmWriteWLADX::indent_column(FILE *, int, int, bool)"
                             );
              }
              fwrite((anonymous_namespace)::AsmWriteWLADX::indent_column(_IO_FILE*,int,int,bool)::
                     spaces,1,(long)iVar34,(FILE *)__stream);
              fprintf((FILE *)__stream,"; %s",proposals._M_t._M_impl._0_8_);
            }
            fputc(10,(FILE *)__stream);
            if ((_Base_ptr *)proposals._M_t._M_impl._0_8_ !=
                &proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)proposals._M_t._M_impl._0_8_);
            }
            if ((char *)target_label._0_8_ != target_label + 0x10) {
              operator_delete((void *)target_label._0_8_);
            }
            if ((char *)target_1._0_8_ != target_1 + 0x10) {
              operator_delete((void *)target_1._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)line_use_comment._M_dataplus._M_p != &line_use_comment.field_2) {
              operator_delete(line_use_comment._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)line_comment_1._M_dataplus._M_p != &line_comment_1.field_2) {
              operator_delete(line_comment_1._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)header._data != local_1028) {
              operator_delete(header._data);
            }
            bVar18 = (bool)(bVar18 | p == _Var53);
          }
          _Var53 = _Var53 + _S_black;
        } while (_Var53 <= p);
      }
      uVar29 = *(ulong *)&p_Var33[1].field_0x4;
      uVar57 = uVar29 >> 0x20;
      if (uVar57 == 0) {
        __assert_fail("variant_lookup.count != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                      ,0x26d,
                      "void snestistics::asm_writer(ReportWriter &, const Options &, Trace &, const AnnotationResolver &, const RomAccessor &)"
                     );
      }
      data = RomAccessor::evalPtr(rom_accessor,p);
      p_Var1 = &proposals._M_t._M_impl.super__Rb_tree_header;
      bVar3 = *data;
      uVar29 = uVar29 & 0xffffffff;
      pOVar30 = (local_32b8->ops_variants).
                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar29;
      uVar55._0_2_ = pOVar30->P;
      uVar55._2_2_ = pOVar30->DP;
      uVar44 = 1 << ((byte)p & 0x1f) & (local_32b8->is_predicted)._state[p >> 5];
      if ((uVar55 >> 8 & 1) != 0) {
        printf("emu mode at pc %06X\n",(ulong)p);
      }
      target_1[0x70] = '\0';
      target_1[0x71] = '\0';
      target_1[0x72] = '\0';
      target_1[0x73] = '\0';
      target_1[0x74] = '\0';
      target_1[0x75] = '\0';
      target_1[0x76] = '\0';
      target_1[0x77] = '\0';
      target_1[0x78] = '\0';
      target_1[0x79] = '\0';
      target_1[0x7a] = '\0';
      target_1[0x7b] = '\0';
      target_1[0x7c] = '\0';
      target_1[0x7d] = '\0';
      target_1[0x7e] = '\0';
      target_1[0x7f] = '\0';
      target_1[0x60] = '\0';
      target_1[0x61] = '\0';
      target_1[0x62] = '\0';
      target_1[99] = '\0';
      target_1[100] = '\0';
      target_1[0x65] = '\0';
      target_1[0x66] = '\0';
      target_1[0x67] = '\0';
      target_1[0x68] = '\0';
      target_1[0x69] = '\0';
      target_1[0x6a] = '\0';
      target_1[0x6b] = '\0';
      target_1[0x6c] = '\0';
      target_1[0x6d] = '\0';
      target_1[0x6e] = '\0';
      target_1[0x6f] = '\0';
      target_1[0x50] = '\0';
      target_1[0x51] = '\0';
      target_1[0x52] = '\0';
      target_1[0x53] = '\0';
      target_1[0x54] = '\0';
      target_1[0x55] = '\0';
      target_1[0x56] = '\0';
      target_1[0x57] = '\0';
      target_1[0x58] = '\0';
      target_1[0x59] = '\0';
      target_1[0x5a] = '\0';
      target_1[0x5b] = '\0';
      target_1[0x5c] = '\0';
      target_1[0x5d] = '\0';
      target_1[0x5e] = '\0';
      target_1[0x5f] = '\0';
      target_1[0x40] = '\0';
      target_1[0x41] = '\0';
      target_1[0x42] = '\0';
      target_1[0x43] = '\0';
      target_1[0x44] = '\0';
      target_1[0x45] = '\0';
      target_1[0x46] = '\0';
      target_1[0x47] = '\0';
      target_1[0x48] = '\0';
      target_1[0x49] = '\0';
      target_1[0x4a] = '\0';
      target_1[0x4b] = '\0';
      target_1[0x4c] = '\0';
      target_1[0x4d] = '\0';
      target_1[0x4e] = '\0';
      target_1[0x4f] = '\0';
      target_1[0x30] = '\0';
      target_1[0x31] = '\0';
      target_1[0x32] = '\0';
      target_1[0x33] = '\0';
      target_1[0x34] = '\0';
      target_1[0x35] = '\0';
      target_1[0x36] = '\0';
      target_1[0x37] = '\0';
      target_1[0x38] = '\0';
      target_1[0x39] = '\0';
      target_1[0x3a] = '\0';
      target_1[0x3b] = '\0';
      target_1[0x3c] = '\0';
      target_1[0x3d] = '\0';
      target_1[0x3e] = '\0';
      target_1[0x3f] = '\0';
      target_1[0x20] = '\0';
      target_1[0x21] = '\0';
      target_1[0x22] = '\0';
      target_1[0x23] = '\0';
      target_1[0x24] = '\0';
      target_1[0x25] = '\0';
      target_1[0x26] = '\0';
      target_1[0x27] = '\0';
      target_1[0x28] = '\0';
      target_1[0x29] = '\0';
      target_1[0x2a] = '\0';
      target_1[0x2b] = '\0';
      target_1[0x2c] = '\0';
      target_1[0x2d] = '\0';
      target_1[0x2e] = '\0';
      target_1[0x2f] = '\0';
      target_1[0x10] = '\0';
      target_1[0x11] = '\0';
      target_1[0x12] = '\0';
      target_1[0x13] = '\0';
      target_1[0x14] = '\0';
      target_1[0x15] = '\0';
      target_1[0x16] = '\0';
      target_1[0x17] = '\0';
      target_1[0x18] = '\0';
      target_1[0x19] = '\0';
      target_1[0x1a] = '\0';
      target_1[0x1b] = '\0';
      target_1[0x1c] = '\0';
      target_1[0x1d] = '\0';
      target_1[0x1e] = '\0';
      target_1[0x1f] = '\0';
      target_1[0] = '\0';
      target_1[1] = '\0';
      target_1[2] = '\0';
      target_1[3] = '\0';
      target_1[4] = '\0';
      target_1[5] = '\0';
      target_1[6] = '\0';
      target_1[7] = '\0';
      target_1[8] = '\0';
      target_1[9] = '\0';
      target_1[10] = '\0';
      target_1[0xb] = '\0';
      target_1[0xc] = '\0';
      target_1[0xd] = '\0';
      target_1[0xe] = '\0';
      target_1[0xf] = '\0';
      target_label[0x70] = '\0';
      target_label[0x71] = '\0';
      target_label[0x72] = '\0';
      target_label[0x73] = '\0';
      target_label[0x74] = '\0';
      target_label[0x75] = '\0';
      target_label[0x76] = '\0';
      target_label[0x77] = '\0';
      target_label[0x78] = '\0';
      target_label[0x79] = '\0';
      target_label[0x7a] = '\0';
      target_label[0x7b] = '\0';
      target_label[0x7c] = '\0';
      target_label[0x7d] = '\0';
      target_label[0x7e] = '\0';
      target_label[0x7f] = '\0';
      target_label[0x60] = '\0';
      target_label[0x61] = '\0';
      target_label[0x62] = '\0';
      target_label[99] = '\0';
      target_label[100] = '\0';
      target_label[0x65] = '\0';
      target_label[0x66] = '\0';
      target_label[0x67] = '\0';
      target_label[0x68] = '\0';
      target_label[0x69] = '\0';
      target_label[0x6a] = '\0';
      target_label[0x6b] = '\0';
      target_label[0x6c] = '\0';
      target_label[0x6d] = '\0';
      target_label[0x6e] = '\0';
      target_label[0x6f] = '\0';
      target_label[0x50] = '\0';
      target_label[0x51] = '\0';
      target_label[0x52] = '\0';
      target_label[0x53] = '\0';
      target_label[0x54] = '\0';
      target_label[0x55] = '\0';
      target_label[0x56] = '\0';
      target_label[0x57] = '\0';
      target_label[0x58] = '\0';
      target_label[0x59] = '\0';
      target_label[0x5a] = '\0';
      target_label[0x5b] = '\0';
      target_label[0x5c] = '\0';
      target_label[0x5d] = '\0';
      target_label[0x5e] = '\0';
      target_label[0x5f] = '\0';
      target_label[0x40] = '\0';
      target_label[0x41] = '\0';
      target_label[0x42] = '\0';
      target_label[0x43] = '\0';
      target_label[0x44] = '\0';
      target_label[0x45] = '\0';
      target_label[0x46] = '\0';
      target_label[0x47] = '\0';
      target_label[0x48] = '\0';
      target_label[0x49] = '\0';
      target_label[0x4a] = '\0';
      target_label[0x4b] = '\0';
      target_label[0x4c] = '\0';
      target_label[0x4d] = '\0';
      target_label[0x4e] = '\0';
      target_label[0x4f] = '\0';
      target_label[0x30] = '\0';
      target_label[0x31] = '\0';
      target_label[0x32] = '\0';
      target_label[0x33] = '\0';
      target_label[0x34] = '\0';
      target_label[0x35] = '\0';
      target_label[0x36] = '\0';
      target_label[0x37] = '\0';
      target_label[0x38] = '\0';
      target_label[0x39] = '\0';
      target_label[0x3a] = '\0';
      target_label[0x3b] = '\0';
      target_label[0x3c] = '\0';
      target_label[0x3d] = '\0';
      target_label[0x3e] = '\0';
      target_label[0x3f] = '\0';
      target_label[0x20] = '\0';
      target_label[0x21] = '\0';
      target_label[0x22] = '\0';
      target_label[0x23] = '\0';
      target_label[0x24] = '\0';
      target_label[0x25] = '\0';
      target_label[0x26] = '\0';
      target_label[0x27] = '\0';
      target_label[0x28] = '\0';
      target_label[0x29] = '\0';
      target_label[0x2a] = '\0';
      target_label[0x2b] = '\0';
      target_label[0x2c] = '\0';
      target_label[0x2d] = '\0';
      target_label[0x2e] = '\0';
      target_label[0x2f] = '\0';
      target_label[0x10] = '\0';
      target_label[0x11] = '\0';
      target_label[0x12] = '\0';
      target_label[0x13] = '\0';
      target_label[0x14] = '\0';
      target_label[0x15] = '\0';
      target_label[0x16] = '\0';
      target_label[0x17] = '\0';
      target_label[0x18] = '\0';
      target_label[0x19] = '\0';
      target_label[0x1a] = '\0';
      target_label[0x1b] = '\0';
      target_label[0x1c] = '\0';
      target_label[0x1d] = '\0';
      target_label[0x1e] = '\0';
      target_label[0x1f] = '\0';
      target_label[0] = '\0';
      target_label[1] = '\0';
      target_label[2] = '\0';
      target_label[3] = '\0';
      target_label[4] = '\0';
      target_label[5] = '\0';
      target_label[6] = '\0';
      target_label[7] = '\0';
      target_label[8] = '\0';
      target_label[9] = '\0';
      target_label[10] = '\0';
      target_label[0xb] = '\0';
      target_label[0xc] = '\0';
      target_label[0xd] = '\0';
      target_label[0xe] = '\0';
      target_label[0xf] = '\0';
      numBitsNeeded = 8;
      numBytesUsed = calculateFormattingandSize
                               (data,(uVar55 & 0x20) == 0,(uVar55 & 0x10) == 0,target_1,target_label
                                ,&numBitsNeeded);
      proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      uVar55 = *(uint *)(op_codes + (ulong)bVar3 * 0x10 + 8);
      bVar20 = (byte)uVar55;
      bVar37 = 0;
      proposals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      cVar4 = (&jumps)[bVar3];
      bVar60 = cVar4 == '\0';
      if (bVar60) {
        bVar37 = (byte)(0x1801f >> (bVar20 & 0x1f)) & uVar55 < 0x11;
      }
      bVar59 = uVar55 - 0xb < 8;
      proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::resize
                (&variants,uVar57);
      bVar19 = (byte)(0x81a034 >> (bVar20 & 0x1f)) & uVar55 < 0x18;
      bVar2 = uVar55 < 0xe & (byte)(0x3086 >> (bVar20 & 0x1f));
      bVar20 = (byte)(0x854008 >> (bVar20 & 0x1f)) & uVar55 < 0x18;
      pOVar45 = (local_32b8->ops_variants).
                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar29;
      memcpy(variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
             _M_impl.super__Vector_impl_data._M_start,pOVar45,uVar57 * 0x14);
      pOVar58 = variants.
                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pOVar30 = variants.
                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_32a4 = 0x10000;
        uVar48 = 0;
        local_32ac = (uint)CONCAT71((int7)((ulong)pOVar45 >> 8),1);
        local_330c = 0;
        uVar54 = 0;
        iVar24 = 1;
        local_3310 = 0;
        local_32a8 = 0;
        uVar52 = 0;
        uVar55 = 0;
        iVar25 = 1;
        local_3304 = 0;
      }
      else {
        iVar25 = 1;
        local_3304 = 0;
        uVar55 = 0;
        iVar38 = 0;
        iVar34 = 1;
        uVar23 = 0;
        local_3310 = 0;
        iVar24 = 1;
        uVar54 = 0;
        local_330c = 0;
        local_32ac = 1;
        uVar48 = 0;
        pOVar45 = variants.
                  super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          bVar61 = (pOVar45->P & 0x20) == 0;
          if (SUB31(uVar54,0) != bVar61) {
            uVar54 = 0;
            iVar24 = 0;
          }
          if (local_3310 == 0) {
            iVar24 = 1;
            local_3310 = 1;
            uVar54 = (uint3)bVar61;
          }
          bVar61 = (pOVar45->P & 0x10) == 0;
          uVar46 = uVar48;
          if (SUB31(uVar48,0) != bVar61) {
            uVar46 = 0;
            local_32ac = 0;
          }
          uVar48 = (uint3)bVar61;
          if (local_330c != 0) {
            uVar48 = uVar46;
          }
          if (local_330c == 0) {
            local_32ac = 1;
            local_330c = 1;
          }
          if (uVar23 != pOVar45->DP) {
            uVar23 = 0;
            iVar34 = 0;
          }
          if (iVar38 == 0) {
            iVar38 = 1;
            uVar23 = pOVar45->DP;
            iVar34 = 1;
          }
          uVar52 = uVar55 & 0xff;
          if ((char)uVar55 != (char)*(uint *)&pOVar45->DB) {
            uVar52 = 0;
            iVar25 = 0;
          }
          uVar55 = uVar52;
          if (local_3304 == 0) {
            uVar55 = *(uint *)&pOVar45->DB;
          }
          if (local_3304 == 0) {
            iVar25 = 1;
            local_3304 = 1;
          }
          if (bVar2 == 0) {
            pOVar45->X = 0;
          }
          if (bVar20 == 0) {
            pOVar45->Y = 0;
          }
          if (bVar37 == 0) {
            pOVar45->DB = '\0';
          }
          if (!bVar60 || !bVar59) {
            pOVar45->DP = 0;
          }
          if (bVar19 == 0) {
            pOVar45->indirect_base_pointer = 0;
          }
          pOVar45 = pOVar45 + 1;
        } while (pOVar45 !=
                 variants.
                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
        uVar52 = iVar38 << 0x18;
        local_32a4 = iVar34 << 0x10;
        local_32a8 = (uint)uVar23;
      }
      if (bVar3 == 0x82) {
        header._data = (uchar *)CONCAT44(header._data._4_4_,
                                         (uint)(-1 < (short)((ushort)data[2] << 8)) * 0x10000 +
                                         *(ushort *)(data + 1) + p + -0xfffd);
        pmVar28 = std::
                  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&proposals,(key_type *)&header);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar28,0,(char *)pmVar28->_M_string_length,0x16c0b3);
      }
      else if ((&branches)[bVar3] == '\x01') {
        header._data = (uchar *)CONCAT44(header._data._4_4_,
                                         (uint)(-1 < (char)data[1]) * 0x100 + data[1] + p + -0xfe);
        pmVar28 = std::
                  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&proposals,(key_type *)&header);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar28,0,(char *)pmVar28->_M_string_length,0x16c0b3);
      }
      else {
        if (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          __new_size = 0;
        }
        else {
          uVar29 = ((long)variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
          lVar32 = 0x3f;
          if (uVar29 != 0) {
            for (; uVar29 >> lVar32 == 0; lVar32 = lVar32 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<snestistics::OpInfo*,std::vector<snestistics::OpInfo,std::allocator<snestistics::OpInfo>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (variants.
                     super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     variants.
                     super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar32 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<snestistics::OpInfo*,std::vector<snestistics::OpInfo,std::allocator<snestistics::OpInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pOVar30,pOVar58);
          if (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            __new_size = 0;
          }
          else {
            uVar41 = 0;
            uVar29 = 1;
            uVar57 = 0;
            do {
              uVar39 = uVar29;
              if ((uVar41 == 0) ||
                 (variants.
                  super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar57].DB !=
                  variants.
                  super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar41 - 1].DB)) {
LAB_001279c6:
                uVar9 = *(undefined3 *)
                         &variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar57].field_0x11;
                variants.
                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar41].DB =
                     variants.
                     super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar57].DB;
                *(undefined3 *)
                 &variants.
                  super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar41].field_0x11 = uVar9;
                pOVar30 = variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar57;
                PVar10 = pOVar30->jump_target;
                uVar11 = pOVar30->P;
                uVar12 = pOVar30->DP;
                uVar13 = pOVar30->X;
                uVar14 = pOVar30->Y;
                pOVar58 = variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar41;
                pOVar58->indirect_base_pointer = pOVar30->indirect_base_pointer;
                pOVar58->jump_target = PVar10;
                pOVar58->P = uVar11;
                pOVar58->DP = uVar12;
                pOVar58->X = uVar13;
                pOVar58->Y = uVar14;
                uVar41 = uVar41 + 1;
              }
              else {
                pOVar30 = variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar57;
                pOVar58 = variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start + (uVar41 - 1);
                if ((pOVar30->DP != pOVar58->DP) ||
                   ((((pOVar30->indirect_base_pointer != pOVar58->indirect_base_pointer ||
                      (pOVar30->X != pOVar58->X)) || (pOVar30->Y != pOVar58->Y)) ||
                    ((pOVar30->P != pOVar58->P || (pOVar30->jump_target != pOVar58->jump_target)))))
                   ) goto LAB_001279c6;
              }
              uVar49 = ((long)variants.
                              super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)variants.
                              super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
              uVar29 = (ulong)((int)uVar39 + 1);
              uVar57 = uVar39;
            } while (uVar39 <= uVar49 && uVar49 - uVar39 != 0);
            __new_size = (size_type_conflict)uVar41;
          }
        }
        std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::resize
                  (&variants,__new_size);
        if (cVar4 == '\0') {
          if ((uVar44 == 0) &&
             (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
            local_32b0 = p >> 0x10;
            local_3170 = (ulong)(p + 2);
            uVar29 = 0;
            do {
              pOVar30 = variants.
                        super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              memset(&header,0,0x1004);
              uVar57 = uVar29;
              if (bVar2 != 0 || bVar20 != 0) {
                uVar41 = 0;
                if (bVar2 != 0) {
                  uVar57 = (ulong)header._data >> 0x10;
                  header._data = (uchar *)CONCAT62((uint6)uVar57 & 0xffffffffff00,0x3d58);
                  local_38 = 2;
                  uVar41 = 2;
                }
                if (bVar20 != 0) {
                  local_1028[0]._M_local_buf[(ulong)uVar41 - 0xe] = '\0';
                  *(undefined2 *)((long)local_1028 + ((ulong)uVar41 - 0x10)) = 0x3d59;
                  local_38 = uVar41 + 2;
                }
                line_comment_1._M_dataplus._M_p = (pointer)0xffffffff;
                line_comment_1._M_string_length =
                     line_comment_1._M_string_length & 0xffffffff00000000;
                Range::add((Range *)&line_comment_1,(uint)(&pOVar30[uVar29].X)[bVar2 ^ 1]);
                uVar41 = (uint)uVar29;
                uVar57 = (ulong)(uVar41 + 1);
                uVar39 = ((long)variants.
                                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)variants.
                                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) *
                         -0x3333333333333333;
                if (uVar57 <= uVar39 && uVar39 - uVar57 != 0) {
                  bVar61 = true;
                  uVar43 = 0;
                  uVar39 = uVar29;
                  do {
                    uVar56 = (uint)uVar39;
                    uVar41 = uVar56;
                    if ((variants.
                         super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar57].DB != pOVar30[uVar29].DB)
                       || (variants.
                           super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar57].DP !=
                           pOVar30[uVar29].DP)) break;
                    uVar23 = (&variants.
                               super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar57].X)[bVar2 ^ 1];
                    if (line_comment_1._M_dataplus._M_p._4_4_ < 2) {
LAB_00128a57:
                      Range::add((Range *)&line_comment_1,(uint)uVar23);
                    }
                    else {
                      if (((int)line_comment_1._M_string_length *
                           line_comment_1._M_dataplus._M_p._4_4_ +
                           (int)line_comment_1._M_dataplus._M_p == (uint)uVar23) ||
                         ((int)line_comment_1._M_string_length *
                          (line_comment_1._M_dataplus._M_p._4_4_ - 1) +
                          (int)line_comment_1._M_dataplus._M_p == (uint)uVar23)) goto LAB_00128a57;
                      lVar32 = (long)local_38;
                      if (lVar32 < 0x50) {
                        if (!bVar61) {
                          local_1028[0]._M_local_buf[lVar32 + -0xe] = '\0';
                          *(undefined2 *)((long)local_1028 + lVar32 + -0x10) = 0x202c;
                          local_38 = local_38 + 2;
                        }
                        Range::format((Range *)&line_comment_1,(StringBuilder *)&header);
                        bVar61 = false;
                      }
                      else {
                        uVar43 = uVar43 + 1;
                      }
                      line_comment_1._M_dataplus._M_p = (pointer)0xffffffff;
                      line_comment_1._M_string_length =
                           line_comment_1._M_string_length & 0xffffffff00000000;
                      Range::add((Range *)&line_comment_1,(uint)uVar23);
                    }
                    uVar41 = uVar56 + 1;
                    uVar57 = (ulong)(uVar56 + 2);
                    uVar49 = ((long)variants.
                                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)variants.
                                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x3333333333333333;
                    uVar39 = (ulong)uVar41;
                  } while (uVar57 <= uVar49 && uVar49 - uVar57 != 0);
                  if (uVar43 != 0) {
                    StringBuilder::format((StringBuilder *)&header," and %d more",(ulong)uVar43);
                    uVar57 = (ulong)uVar41;
                    goto LAB_00128ba5;
                  }
                  if (!bVar61) {
                    lVar32 = (long)local_38;
                    local_1028[0]._M_local_buf[lVar32 + -0xe] = '\0';
                    *(undefined2 *)((long)local_1028 + lVar32 + -0x10) = 0x202c;
                    local_38 = local_38 + 2;
                  }
                }
                Range::format((Range *)&line_comment_1,(StringBuilder *)&header);
                uVar57 = (ulong)uVar41;
              }
LAB_00128ba5:
              bVar3 = *data;
              uVar39 = (ulong)bVar3;
              iVar34 = *(int *)(opCodeInfo + uVar39 * 0x18 + 0x10);
              if (iVar34 < 4) goto switchD_00128ec9_caseD_d;
              uVar41 = local_32b0;
              if (iVar34 == 4) {
                bVar3 = data[1];
                uVar23 = (short)local_3170 + -0x100 + (ushort)bVar3;
                if (-1 < (char)bVar3) {
                  uVar23 = (short)local_3170 + (ushort)bVar3;
                }
                goto LAB_00128c16;
              }
              if ((uVar39 == 0x82) || (bVar3 == 0x62)) {
                uVar23 = (*(ushort *)(data + 1) << 8 | *(ushort *)(data + 1) >> 8) + (short)p + 3;
                goto LAB_00128c16;
              }
              bVar5 = pOVar30[uVar29].DB;
              switch(iVar34) {
              case 6:
                uVar23 = pOVar30[uVar29].DP + (ushort)data[1];
                uVar41 = 0;
                goto LAB_00128c16;
              default:
                if (bVar3 == 0xdc) {
                  if ((&jumps)[uVar39] != '\0') {
                    bVar5 = (byte)local_32b0;
                  }
                  if (((char)data[2] < '\0') && ((char)bVar5 < '~')) {
                    uVar41 = (uint)bVar5 << 0x10 | (uint)data[2] << 8 | (uint)data[1];
                    uVar21 = RomAccessor::evalByte(rom_accessor,uVar41);
                    uVar22 = RomAccessor::evalByte(rom_accessor,uVar41 + 1);
                    uVar23 = CONCAT11(uVar22,uVar21);
                    uVar41 = (uint)bVar5;
                    goto LAB_00128c16;
                  }
                }
                else if (((bVar3 & 0x7f) == 0x7c) && ((&jumps)[uVar39] == '\0')) {
                  __assert_fail("is_jump",
                                "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                                ,0xb4,
                                "ResultType (anonymous namespace)::evaluateOp(const snestistics::RomAccessor &, const uint8_t *, const CPURegisters &, MagicByte *, MagicWord *, bool *, bool *, bool *, bool *)"
                               );
                }
                break;
              case 0xd:
                break;
              case 0xe:
              case 0xf:
              case 0x10:
                goto LAB_00128edb;
              case 0x11:
              case 0x12:
                bVar5 = data[3];
LAB_00128edb:
                uVar23 = *(ushort *)(data + 1);
                uVar41 = (uint)bVar5;
LAB_00128c16:
                iVar34 = local_38;
                uVar41 = (uVar41 & 0xff) * 0x10000;
                _Var35 = (_Rb_tree_color)uVar23;
                _Var53 = uVar41 + _Var35;
                if (((-1 < (short)uVar23) && ((uVar41 >> 0x16 & 1) == 0)) &&
                   (_Var53 = _Var35 + 0x7e0000, 0x1fff < _Var35)) {
                  _Var53 = _Var35;
                }
                line_comment._M_dataplus._M_p._0_4_ = _Var53;
                if (proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                    (_Base_ptr)0x0) {
                  p_Var17 = proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var51 = &proposals._M_t._M_impl.super__Rb_tree_header._M_header;
                  do {
                    p_Var50 = p_Var51;
                    p_Var40 = p_Var17;
                    _Var35 = p_Var40[1]._M_color;
                    p_Var51 = p_Var40;
                    if (_Var35 < _Var53) {
                      p_Var51 = p_Var50;
                    }
                    p_Var17 = (&p_Var40->_M_left)[_Var35 < _Var53];
                  } while ((&p_Var40->_M_left)[_Var35 < _Var53] != (_Base_ptr)0x0);
                  if ((_Rb_tree_header *)p_Var51 != &proposals._M_t._M_impl.super__Rb_tree_header) {
                    if (_Var35 < _Var53) {
                      p_Var40 = p_Var50;
                    }
                    if (p_Var40[1]._M_color <= _Var53) break;
                  }
                }
                line_use_comment._M_dataplus._M_p = (pointer)&line_use_comment.field_2;
                line_use_comment._M_string_length = 0;
                line_use_comment.field_2._M_local_buf[0] = '\0';
                if (bVar37 == 0 && (!bVar60 || !bVar59)) {
                  bVar61 = false;
                  memset(&line_comment_1,0,0x1004);
                  if (iVar34 != 0) goto LAB_00128cfa;
                }
                else {
                  memset(&line_comment_1,0,0x1000);
LAB_00128cfa:
                  line_comment_1._M_dataplus._M_p._0_2_ = 0x5b;
                  local_2048 = 1;
                  bVar61 = true;
                }
                bVar62 = bVar37 == 0;
                if (!bVar62) {
                  StringBuilder::format
                            ((StringBuilder *)&line_comment_1,"DB=%X",(ulong)pOVar30[uVar29].DB);
                }
                if (bVar60 && bVar59) {
                  if (!bVar62) {
                    *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) =
                         0x20;
                    local_2048 = local_2048 + 1;
                  }
                  bVar62 = false;
                  StringBuilder::format
                            ((StringBuilder *)&line_comment_1,"DP=%X",(ulong)pOVar30[uVar29].DP);
                }
                if (local_38 != 0) {
                  if (!bVar62) {
                    *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) =
                         0x20;
                    local_2048 = local_2048 + 1;
                  }
                  sVar27 = strlen((char *)&header);
                  memcpy((void *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048),&header
                         ,(long)((sVar27 << 0x20) + 0x100000000) >> 0x20);
                  local_2048 = local_2048 + (int)sVar27;
                }
                if (bVar61) {
                  *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) = 0x5d;
                  local_2048 = local_2048 + 1;
                }
                pmVar28 = std::
                          map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&proposals,(key_type *)&line_comment);
                pcVar7 = (char *)pmVar28->_M_string_length;
                strlen((char *)&line_comment_1);
                std::__cxx11::string::_M_replace((ulong)pmVar28,0,pcVar7,(ulong)&line_comment_1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)line_use_comment._M_dataplus._M_p != &line_use_comment.field_2) {
                  operator_delete(line_use_comment._M_dataplus._M_p);
                }
              }
switchD_00128ec9_caseD_d:
              uVar29 = (ulong)((int)uVar57 + 1);
              uVar57 = ((long)variants.
                              super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)variants.
                              super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
            } while (uVar29 <= uVar57 && uVar57 - uVar29 != 0);
          }
        }
        else if (variants.
                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish !=
                 variants.
                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start) {
          pOVar30 = variants.
                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar29 = 0;
          uVar57 = 1;
          pOVar58 = variants.
                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            if (pOVar58[uVar29].jump_target != 0xffffffff) {
              memset(&header,0,0x1004);
              if (bVar2 != 0) {
                StringBuilder::format((StringBuilder *)&header,"[X=%04X]",(ulong)pOVar58[uVar29].X);
              }
              pmVar28 = std::
                        map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&proposals,&pOVar58[uVar29].jump_target);
              pcVar7 = (char *)pmVar28->_M_string_length;
              strlen((char *)&header);
              std::__cxx11::string::_M_replace((ulong)pmVar28,0,pcVar7,(ulong)&header);
              pOVar30 = variants.
                        super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pOVar58 = variants.
                        super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar29 = ((long)pOVar30 - (long)pOVar58 >> 2) * -0x3333333333333333;
            bVar61 = uVar57 <= uVar29;
            lVar32 = uVar29 - uVar57;
            uVar29 = uVar57;
            uVar57 = (ulong)((int)uVar57 + 1);
          } while (bVar61 && lVar32 != 0);
        }
      }
      line_comment._M_dataplus._M_p = (pointer)&line_comment.field_2;
      line_comment._M_string_length = 0;
      line_comment.field_2._M_local_buf[0] = '\0';
      if (!bVar18) {
        AnnotationResolver::line_info(annotations,p,(string *)0x0,&line_comment,(string *)0x0,false)
        ;
      }
      variant_writer.line_comment = &line_comment;
      variant_writer.annotations = annotations;
      variant_writer.is_jump = (bool)cVar4;
      memset((StringBuilder *)&header,0,0x1004);
      iVar34 = numBitsNeeded;
      uVar46 = (uint3)uVar55;
      if (proposals._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
        cVar16 = target_label[0];
        asm_writer::anon_class_24_3_79b0c3fc::operator()
                  (&line_use_comment,&variant_writer,(StringBuilder *)&header,
                   proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color,
                   (Proposal *)
                   &proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent,
                   target_label[0] != '\0');
        iVar34 = numBitsNeeded;
        if ((cVar16 == '\0') || (line_use_comment._M_string_length == 0)) {
          line_comment_1._M_dataplus._M_p = (pointer)&line_comment_1.field_2;
          sVar27 = strlen(target_1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&line_comment_1,target_1,target_1 + sVar27);
          use_comment_1._M_dataplus._M_p = (pointer)&use_comment_1.field_2;
          sVar27 = strlen((char *)&header);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&use_comment_1,&header,(long)local_1028 + (sVar27 - 0x10));
          anon_unknown.dwarf_18c9a::AsmWriteWLADX::writeInstruction
                    (&writer,p,iVar34,numBytesUsed,&line_comment_1,&use_comment_1,
                     (CombinationBool)(uVar54 | (uint3)(iVar24 << 8) | (uint3)(local_3310 << 0x10)),
                     (CombinationBool)
                     (uVar48 | (uint3)((local_32ac & 0xff) << 8) | (uint3)(local_330c << 0x10)),
                     (Combination8)
                     (uVar46 & 0xff | (uint3)(iVar25 << 8) | (uint3)(local_3304 << 0x10)),
                     (Combination16)(uVar52 | local_32a4 | local_32a8),uVar44 != 0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)use_comment_1._M_dataplus._M_p != &use_comment_1.field_2) {
            operator_delete(use_comment_1._M_dataplus._M_p);
          }
          _Var47._M_p = line_comment_1._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)line_comment_1._M_dataplus._M_p != &line_comment_1.field_2) goto LAB_001280f2;
        }
        else {
          sprintf((char *)&line_comment_1,target_label,line_use_comment._M_dataplus._M_p);
          iVar34 = numBitsNeeded;
          use_comment_1._M_dataplus._M_p = (pointer)&use_comment_1.field_2;
          sVar27 = strlen((char *)&line_comment_1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&use_comment_1,&line_comment_1,
                     (long)&line_comment_1._M_dataplus._M_p + sVar27);
          name_2._M_dataplus._M_p = (pointer)&name_2.field_2;
          sVar27 = strlen((char *)&header);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name_2,&header,(long)local_1028 + (sVar27 - 0x10));
          anon_unknown.dwarf_18c9a::AsmWriteWLADX::writeInstruction
                    (&writer,p,iVar34,numBytesUsed,&use_comment_1,&name_2,
                     (CombinationBool)(uVar54 | (uint3)(iVar24 << 8) | (uint3)(local_3310 << 0x10)),
                     (CombinationBool)
                     (uVar48 | (uint3)((local_32ac & 0xff) << 8) | (uint3)(local_330c << 0x10)),
                     (Combination8)
                     (uVar46 & 0xff | (uint3)(iVar25 << 8) | (uint3)(local_3304 << 0x10)),
                     (Combination16)(uVar52 | local_32a4 | local_32a8),uVar44 != 0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name_2._M_dataplus._M_p != &name_2.field_2) {
            operator_delete(name_2._M_dataplus._M_p);
          }
          _Var47._M_p = use_comment_1._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)use_comment_1._M_dataplus._M_p != &use_comment_1.field_2) {
LAB_001280f2:
            operator_delete(_Var47._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line_use_comment._M_dataplus._M_p != &line_use_comment.field_2) {
          operator_delete(line_use_comment._M_dataplus._M_p);
        }
      }
      else {
        line_comment_1._M_dataplus._M_p = (pointer)&line_comment_1.field_2;
        sVar27 = strlen(target_1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&line_comment_1,target_1,target_1 + sVar27);
        anon_unknown.dwarf_18c9a::AsmWriteWLADX::writeInstruction
                  (&writer,p,iVar34,numBytesUsed,&line_comment_1,&line_comment,
                   (CombinationBool)(uVar54 | (uint3)(iVar24 << 8) | (uint3)(local_3310 << 0x10)),
                   (CombinationBool)
                   (uVar48 | (uint3)((local_32ac & 0xff) << 8) | (uint3)(local_330c << 0x10)),
                   (Combination8)
                   (uVar46 & 0xff | (uint3)(iVar25 << 8) | (uint3)(local_3304 << 0x10)),
                   (Combination16)(uVar52 | local_32a4 | local_32a8),uVar44 != 0);
        p_Var31 = proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line_comment_1._M_dataplus._M_p != &line_comment_1.field_2) {
          operator_delete(line_comment_1._M_dataplus._M_p);
          p_Var31 = proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        for (; (_Rb_tree_header *)p_Var31 != &proposals._M_t._M_impl.super__Rb_tree_header;
            p_Var31 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var31)) {
          _Var53 = p_Var31[1]._M_color;
          p_00 = &p_Var31[1]._M_parent;
          asm_writer::anon_class_24_3_79b0c3fc::operator()
                    (&line_comment_1,&variant_writer,(StringBuilder *)&header,_Var53,
                     (Proposal *)p_00,false);
          iVar25 = (int)p_00;
          line_use_comment._M_dataplus._M_p = (pointer)&line_use_comment.field_2;
          sVar27 = strlen((char *)&header);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&line_use_comment,(StringBuilder *)&header,
                     (long)local_1028 + (sVar27 - 0x10));
          anon_unknown.dwarf_18c9a::AsmWriteWLADX::writeComment
                    (&writer,p,&line_use_comment,_Var53,iVar25);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)line_use_comment._M_dataplus._M_p != &line_use_comment.field_2) {
            operator_delete(line_use_comment._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)line_comment_1._M_dataplus._M_p != &line_comment_1.field_2) {
            operator_delete(line_comment_1._M_dataplus._M_p);
          }
        }
      }
      if (((uVar44 == 0) && (bVar19 == 1)) &&
         ((cVar4 == '\0' &&
          (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish !=
           variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
           _M_impl.super__Vector_impl_data._M_start)))) {
        uVar29 = 0;
        do {
          pOVar30 = variants.
                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar29;
          memset(&line_comment_1,0,0x1004);
          if (bVar2 != 0 || bVar20 != 0) {
            uVar55 = 0;
            if (bVar2 != 0) {
              line_comment_1._M_dataplus._M_p._0_4_ = 0x3d5820;
              local_2048 = 3;
              uVar55 = 3;
            }
            if (bVar20 != 0) {
              *(undefined4 *)((long)&line_comment_1._M_dataplus._M_p + (ulong)uVar55) = 0x3d5920;
              local_2048 = uVar55 + 3;
            }
            line_use_comment._M_dataplus._M_p = (pointer)0xffffffff;
            line_use_comment._M_string_length =
                 line_use_comment._M_string_length & 0xffffffff00000000;
            Range::add((Range *)&line_use_comment,(uint)(&pOVar30->X)[bVar2 ^ 1]);
            uVar57 = (ulong)((int)uVar29 + 1);
            uVar39 = ((long)variants.
                            super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)variants.
                            super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
            if (uVar39 < uVar57 || uVar39 - uVar57 == 0) {
              if (line_use_comment._M_dataplus._M_p._4_4_ != 0) goto LAB_001283a5;
            }
            else {
              bVar18 = true;
              uVar55 = 0;
              do {
                uVar52 = (uint)uVar29;
                uVar44 = uVar52;
                if (((pOVar30->DB !=
                      variants.
                      super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar57].DB) ||
                    (pOVar58 = variants.
                               super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar57,
                    pOVar30->DP != pOVar58->DP)) ||
                   (pOVar30->indirect_base_pointer != pOVar58->indirect_base_pointer)) break;
                uVar23 = (&pOVar58->X)[bVar2 ^ 1];
                if (line_use_comment._M_dataplus._M_p._4_4_ < 2) {
LAB_00128295:
                  Range::add((Range *)&line_use_comment,(uint)uVar23);
                }
                else {
                  if (((int)line_use_comment._M_string_length *
                       line_use_comment._M_dataplus._M_p._4_4_ +
                       (int)line_use_comment._M_dataplus._M_p == (uint)uVar23) ||
                     ((int)line_use_comment._M_string_length *
                      (line_use_comment._M_dataplus._M_p._4_4_ - 1) +
                      (int)line_use_comment._M_dataplus._M_p == (uint)uVar23)) goto LAB_00128295;
                  lVar32 = (long)local_2048;
                  if (lVar32 < 0x81) {
                    if (!bVar18) {
                      *(undefined1 *)((long)&line_comment_1._M_dataplus._M_p + lVar32 + 2) = 0;
                      *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + lVar32) = 0x202c;
                      local_2048 = local_2048 + 2;
                    }
                    Range::format((Range *)&line_use_comment,(StringBuilder *)&line_comment_1);
                    bVar18 = false;
                  }
                  else {
                    uVar55 = uVar55 + 1;
                  }
                  line_use_comment._M_dataplus._M_p = (pointer)0xffffffff;
                  line_use_comment._M_string_length =
                       line_use_comment._M_string_length & 0xffffffff00000000;
                }
                uVar44 = uVar52 + 1;
                uVar57 = (ulong)(uVar52 + 2);
                uVar39 = ((long)variants.
                                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)variants.
                                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) *
                         -0x3333333333333333;
                uVar29 = (ulong)uVar44;
              } while (uVar57 <= uVar39 && uVar39 - uVar57 != 0);
              if ((uVar55 == 0) && (line_use_comment._M_dataplus._M_p._4_4_ != 0)) {
                if (!bVar18) {
                  *(undefined1 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048 + 2) = 0
                  ;
                  *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) =
                       0x202c;
                  local_2048 = local_2048 + 2;
                }
                uVar29 = (ulong)uVar44;
LAB_001283a5:
                Range::format((Range *)&line_use_comment,(StringBuilder *)&line_comment_1);
              }
              else {
                if (uVar55 != 0) {
                  StringBuilder::format
                            ((StringBuilder *)&line_comment_1," (and %d more)",(ulong)uVar55);
                }
                uVar29 = (ulong)uVar44;
              }
            }
          }
          memset((StringBuilder *)&line_use_comment,0,0x1004);
          use_comment_1._M_dataplus._M_p = (pointer)&use_comment_1.field_2;
          use_comment_1._M_string_length = 0;
          use_comment_1.field_2._M_local_buf[0] = '\0';
          psVar36 = &use_comment_1;
          iVar24 = 0;
          AnnotationResolver::label
                    (&name_2,annotations,pOVar30->indirect_base_pointer,psVar36,false);
          iVar25 = (int)psVar36;
          StringBuilder::format
                    ((StringBuilder *)&line_use_comment,"indirect base=%06X",
                     (ulong)pOVar30->indirect_base_pointer);
          if (bVar60 && bVar59) {
            StringBuilder::format((StringBuilder *)&line_use_comment,", DP=%X",(ulong)pOVar30->DP);
          }
          if (bVar37 != 0) {
            StringBuilder::format((StringBuilder *)&line_use_comment,", DB=%X",(ulong)pOVar30->DB);
          }
          if (local_2048 != 0) {
            sVar27 = strlen((char *)&line_comment_1);
            iVar25 = 0;
            memcpy((void *)((long)&line_use_comment._M_dataplus._M_p + (long)local_1040),
                   &line_comment_1,(long)((sVar27 << 0x20) + 0x100000000) >> 0x20);
            local_1040 = local_1040 + (int)sVar27;
          }
          sVar15 = name_2._M_string_length;
          if (name_2._M_string_length != 0) {
            *(undefined4 *)((long)&line_use_comment._M_dataplus._M_p + (long)local_1040) = 0x202d20;
            iVar25 = local_1040 + 3;
            memcpy((void *)((long)&line_use_comment._M_dataplus._M_p + (long)local_1040 + 3),
                   name_2._M_dataplus._M_p,
                   (long)((name_2._M_string_length << 0x20) + 0x100000000) >> 0x20);
            local_1040 = local_1040 + 3 + (int)sVar15;
          }
          sVar15 = use_comment_1._M_string_length;
          if (use_comment_1._M_string_length != 0) {
            *(undefined4 *)((long)&line_use_comment._M_dataplus._M_p + (long)local_1040) = 0x202d20;
            iVar25 = local_1040 + 3;
            memcpy((void *)((long)&line_use_comment._M_dataplus._M_p + (long)local_1040 + 3),
                   use_comment_1._M_dataplus._M_p,
                   (long)((use_comment_1._M_string_length << 0x20) + 0x100000000) >> 0x20);
            local_1040 = local_1040 + 3 + (int)sVar15;
          }
          local_3190._M_dataplus._M_p = (pointer)&local_3190.field_2;
          sVar27 = strlen((char *)&line_use_comment);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3190,&line_use_comment,
                     (long)&line_use_comment._M_dataplus._M_p + sVar27);
          anon_unknown.dwarf_18c9a::AsmWriteWLADX::writeComment(&writer,p,&local_3190,iVar25,iVar24)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3190._M_dataplus._M_p != &local_3190.field_2) {
            operator_delete(local_3190._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name_2._M_dataplus._M_p != &name_2.field_2) {
            operator_delete(name_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)use_comment_1._M_dataplus._M_p != &use_comment_1.field_2) {
            operator_delete(use_comment_1._M_dataplus._M_p);
          }
          uVar29 = (ulong)((int)uVar29 + 1);
          uVar57 = ((long)variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        } while (uVar29 <= uVar57 && uVar57 - uVar29 != 0);
      }
      pDVar8 = (local_32b8->dma_transfers).
               super__Vector_base<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((((long)(local_32b8->dma_transfers).
                  super__Vector_base<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar8 >> 2) *
           -0x3333333333333333 != 0) && (pDVar8->pc == p)) {
        memset(&line_comment_1,0,0x1004);
        __assert_fail("d.b_address == 0x80",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                      ,0x3c0,
                      "void snestistics::asm_writer(ReportWriter &, const Options &, Trace &, const AnnotationResolver &, const RomAccessor &)"
                     );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line_comment._M_dataplus._M_p != &line_comment.field_2) {
        operator_delete(line_comment._M_dataplus._M_p);
      }
      _Var53 = numBytesUsed + p;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&proposals._M_t);
      p_Var33 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var33);
    } while (p_Var33 != local_3168);
  }
  if (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(variants.
                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((writer.m_outFile != (FILE *)0x0) && ((writer.m_bankOpen & 1U) != 0)) {
    fwrite("\n.ENDS\n\n",8,1,(FILE *)writer.m_outFile);
  }
  return;
}

Assistant:

void asm_writer(ReportWriter &report, const Options &options, Trace &trace, const AnnotationResolver &annotations, const RomAccessor &rom_accessor) {
	AsmWriteWLADX writer(report, options, rom_accessor);

	int next_dma_event = 0;

	for (const Annotation &a : annotations._annotations) {
		if (a.type == ANNOTATION_FUNCTION || (a.type == ANNOTATION_LINE && !a.name.empty()))
			trace.labels.set_bit(a.startOfRange);
	}

	writer.writeSeperator("Header");

	if (!options.asm_header_file.empty()) {
		Array<unsigned char> header;
		read_file(options.asm_header_file, header);
		fwrite(&header[0], header.size(), 1, report.report);
		char newline = '\n';
		fwrite(&newline, 1, 1, report.report);
	}

	writer.write_vectors(annotations, trace.labels);

	writer.writeSeperator("Data");

	// Generate EQU for each label
	// TODO: Only include USED labels?
	for (const Annotation &a : annotations._annotations) {
		if (a.type != ANNOTATION_DATA)
			continue;

		// NOTE: We only use 16-bit here... the high byte is almost never used in an op
		// TODO: Validate so this doesn't mess thing up when we use it
		char target[512];
		sprintf(target, "$%04X", a.startOfRange&0xFFFF);
		writer.writeDefine(a.name, target, a.comment.empty() ? a.useComment : a.comment);
	}

	writer.writeSeperator("Code");

	Pointer nextOp(INVALID_POINTER);

	std::vector<OpInfo> variants;
	variants.reserve(1024*64);

	// Now iterate the ops
	for (auto opsit = trace.ops.begin(); opsit != trace.ops.end(); ++opsit) {
		const Pointer pc = opsit->first;

		if (nextOp == INVALID_POINTER) {
			nextOp = pc;
		}

		bool emitted_label = false;

		// TODO: Emit any labels that we might have skipped as well as label for current line
		//       This is mostly if the static jump predictor is predicting a jump into non-ops.
		for (Pointer p(nextOp); p <= pc; ++p) {
			if (trace.labels[p]) {
				// Emit label?
				std::string label, line_comment, line_use_comment;

				annotations.line_info(p, &label, &line_comment, &line_use_comment, true);

				std::string description = line_comment;
				if (line_comment.empty()) {
					description = line_use_comment;
				}

				bool shortmode = false;//!multiline && description.size() < 20;

				writer.writeLabel(p, label, shortmode ? "" : description, shortmode ? description : "");

				if (p == pc)
					emitted_label = true;
			}
		}

		const Trace::OpVariantLookup variant_lookup = opsit->second;
		assert(variant_lookup.count != 0);

		const uint8_t *data = rom_accessor.evalPtr(pc);
		const uint8_t opcode = *data;

		// Determine number of bytes needed for this instruction
		// Here I've assumed that either these flags agree for ALL variants, or that they are irrelevant for this opcode
		const OpInfo &first_variant = trace.variant(variant_lookup, 0);
		const bool acc16 = is_memory_accumulator_wide(first_variant.P);
		const bool ind16 = is_index_wide(first_variant.P);
		const bool emu   = is_emulation_mode(first_variant.P);
		const bool is_predicted = trace.is_predicted[pc];
		if (emu) printf("emu mode at pc %06X\n", pc);

		char target[128] = "\0";
		char target_label[128] = "\0";
		int numBitsNeeded = 8;

		const uint32_t numBytesNeeded = calculateFormattingandSize(data, acc16, ind16, target, target_label, &numBitsNeeded);

		nextOp = pc + numBytesNeeded;

		typedef std::string Proposal;
		typedef std::map<Pointer, Proposal> Proposals;
		Proposals proposals; // Given destionation/source give comment on how we got there

		const bool is_jump = jumps[opcode]; // TODO: Cover all jumps we want? And not too many?

		// Does adress depend on ....?
		bool is_indirect = cputable::is_indirect(opcode);
		const bool depend_X = cputable::address_depend_x(opcode);
		const bool depend_Y = cputable::address_depend_y(opcode);
		const bool depend_DB = cputable::address_depend_db(opcode);
		const bool depend_DP = is_jump ? false : cputable::address_depend_dp(opcode);

		// First copy all variants into our local vector where we can modify
		variants.resize(variant_lookup.count);
		memcpy(&variants[0], &trace.ops_variants[variant_lookup.offset], variant_lookup.count * sizeof(OpInfo));

		// These know if they have been assigned no value, one value (maybe multiple times) or multiple different values
		Combination8 shared_db;
		Combination16 shared_dp;
		CombinationBool accumulator_wide;
		CombinationBool index_wide;

		{
			// NOTE-TODO: While an op might depend on say DB it might not use it if adress is in $0000-$1999

			// Zero out unused registers so our sort get items in correct order
			for (OpInfo &o : variants) {
				accumulator_wide = is_memory_accumulator_wide(o.P);
				index_wide = is_index_wide(o.P);
				shared_dp = o.DP;
				shared_db = o.DB;
				if (!depend_X) o.X = 0;
				if (!depend_Y) o.Y = 0;
				if (!depend_DB) o.DB = 0;
				if (!depend_DP) o.DP = 0;
				if (!is_indirect) o.indirect_base_pointer = 0;
			}
		}

		if (opcode == 0x82) {
			// BRL
			uint16_t operand16 = data[1]|(data[2]<<8);
			const Pointer branch_target = branch16(pc, operand16);
			proposals[branch_target] = "";
		} else if (branches[opcode]) {
			const Pointer branch_target = branch8(pc, data[1]);
			proposals[branch_target] = "";
		} else {
			// Sort and make variants unique
			std::sort(variants.begin(), variants.end());

			uint32_t num_unique_variants = 0;

			// Remove duplicates
			for (uint32_t source_idx = 0; source_idx < variants.size(); source_idx++) {
				if (num_unique_variants == 0 || variants[source_idx] != variants[num_unique_variants - 1]) {
					variants[num_unique_variants++] = variants[source_idx];
				}
			}
			variants.resize(num_unique_variants);

			if (is_jump) {
				for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {
					const OpInfo &vit = variants[variant_idx];
					if (vit.jump_target == INVALID_POINTER)
						continue;
					StringBuilder sb;
					sb.clear();
					if (depend_X)
						sb.format("[X=%04X]", vit.X);
					proposals[vit.jump_target] = sb.c_str();
				}

			} else if (!is_predicted) {

				for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {

					const OpInfo &vit = variants[variant_idx];

					StringBuilder ranges;
					if (depend_X||depend_Y) {
						if (depend_X) ranges.add("X=");
						if (depend_Y) ranges.add("Y=");

						int max_size = 80;
						int skipped = 0;

						bool first = true;

						Range r;
						r.add(depend_X?vit.X:vit.Y);
						for (uint32_t v = variant_idx+1; v < variants.size(); ++v) {
							const OpInfo &vi = variants[v];
							if (vi.DB != vit.DB || vi.DP != vit.DP)
								break;
							int value = depend_X ? variants[v].X : variants[v].Y;
							if (r.fits(value)) {
								r.add(value);
							} else {
								bool skip = ranges.length() >= max_size;
								if (!skip) {
									if (!first) ranges.add(", "); first = false;
									r.format(ranges);
								} else {
									skipped++;
								}
								r.reset();
								r.add(value);
							}
							variant_idx++;
						}
						if (skipped == 0) {
							if (!first) ranges.add(", "); first = false;
							r.format(ranges);
						} else {
							ranges.format(" and %d more", skipped);
						}
					}

					CPURegisters reg;
					reg.P = vit.P;
					reg.dp = vit.DP;
					reg.db = vit.DB;
					reg.pc = pc & 0xFFFF;
					reg.pb = pc >> 16;
					reg.reg_X = 0; // Start at 0 to get base pointer
					reg.reg_Y = 0; // Start at 0 to get base pointer
					MagicByte rb(0);
					MagicWord ra(0);
					ra.set_unknown();
					rb.set_unknown();
					assert(!ra.isKnown() && !rb.isKnown());
					const ResultType r = evaluateOp(rom_accessor, data, reg, &rb, &ra, nullptr, nullptr, nullptr, nullptr);

					if (r == SA_ADRESS && rb.isKnown() && ra.isKnown()) {
						const Pointer p = rom_accessor.lorom_bank_remap((rb.value << 16) | ra.value);

						//if((p>>16)!=rb.value) // data bank was removed due to adressing being shuffled into 7E
						// depend_DB = false;

						if (proposals.find(p) != proposals.end())
							continue;

						std::string use_comment;

						bool has_remark = depend_DB || depend_DP || !ranges.empty();

						StringBuilder sb;
						if (!use_comment.empty()) {
							sb.add(use_comment);
							if (has_remark)
								sb.add(" ");
						}
						bool first = true;
						if (has_remark)
							sb.add("[");
						if (depend_DB) {
							if (!first) sb.add(" "); first = false;
							sb.format("DB=%X", vit.DB);
						}
						if (depend_DP) {
							if (!first) sb.add(" "); first = false;
							sb.format("DP=%X", vit.DP);
						}
						if (!ranges.empty()) {
							if (!first) sb.add(" "); first = false;
							sb.add(ranges.c_str());
						}
						if (has_remark)
							sb.add("]");

						proposals[p] = sb.c_str();
					}
				}
			}
		}

		std::string line_comment;
		if (!emitted_label) {
			annotations.line_info(pc, nullptr, &line_comment, nullptr, false);
		}

		auto variant_writer = [&annotations, &line_comment, is_jump](StringBuilder &ss, const Pointer target_pointer, const Proposal &p, bool name_in_code) {
			ss.clear();
			std::string use_comment, pointer_comment = p;
			const std::string name = annotations.label(target_pointer, &use_comment, is_jump);

			if (!name_in_code || name.empty()) {
				if (!name.empty()) {
					ss.format("%s ", name.c_str()); // Name
				} else {
					ss.format("%06X ", target_pointer);
				}
			}

			bool first = true;
			if (!line_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(line_comment);
			}
			if (!use_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(use_comment);
			}
			if (!pointer_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(pointer_comment);
			}
			return name;
		};

		StringBuilder ss;

		if (proposals.size() == 1) {

			// All variant agree that this is the only choice
			// If we have a valid label we might be able to use that in the op-code
			// It might not be possible to codify it though since it might generate the wrong opcode
			// If target_label is non-empty we can codify using a label

			const bool name_in_code = strcmp(target_label, "") != 0;
			std::string name = variant_writer(ss, proposals.begin()->first, proposals.begin()->second, name_in_code);

			if (!name_in_code || name.empty()) {
				writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, target, ss.c_str(), accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			} else {
				char wow[256];
				sprintf(wow, target_label, name.c_str());
				writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, wow, ss.c_str(), accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			}
		} else {
			writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, target, line_comment, accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			// List all possible targets in comments!
			for (auto pit = proposals.begin(); pit != proposals.end(); ++pit) {
				std::string name = variant_writer(ss, pit->first, pit->second, false);
				writer.writeComment(pc, ss.c_str(), 0, 10);
			}
		}

		if (is_indirect && !is_jump && !is_predicted) {
			for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {

				const OpInfo &v = variants[variant_idx];

				StringBuilder ranges;
					
				if (depend_X||depend_Y) {
					if (depend_X) ranges.add(" X=");
					if (depend_Y) ranges.add(" Y=");
					Range r;
					bool first = true;
					int skipped = 0;

					r.add(depend_X ? v.X : v.Y);

					for (uint32_t vi2 = variant_idx+1; vi2 < variants.size(); ++vi2) {
						const OpInfo &v2 = variants[vi2];
						if (v.DB != v2.DB) break;
						if (v.DP != v2.DP) break;
						if (v.indirect_base_pointer != v2.indirect_base_pointer) break;

						int value = depend_X ? v2.X : v2.Y;

						if (r.fits(value)) {
							r.add(value);
								
						} else {
							if (ranges.length() > 128) {
								skipped++;
							} else {
								if (!first)	ranges.add(", "); first = false;
								r.format(ranges);
							}
							r.reset();
						}

						variant_idx++;
					}
					if (skipped==0 && r.N != 0) {
						if (!first)	ranges.add(", "); first = false;
						r.format(ranges);
					} else if (skipped !=0) {
						ranges.format(" (and %d more)", skipped);
					}
				}

				StringBuilder ss;

				std::string use_comment;
				const std::string name = annotations.label(v.indirect_base_pointer, &use_comment, is_jump);

				ss.format("indirect base=%06X", v.indirect_base_pointer);
				if (depend_DP) ss.format(", DP=%X", v.DP);
				if (depend_DB) ss.format(", DB=%X", v.DB);

				if (!ranges.empty()) {
					ss.add(ranges.c_str());
				}

				if (!name.empty()) {
					ss.add(" - ", name);
				}

				if (!use_comment.empty()) {
					ss.add(" - ", use_comment);
				}

				writer.writeComment(pc, ss.c_str(), 0, 10);
			}
		}

		while (next_dma_event < trace.dma_transfers.size() && trace.dma_transfers[next_dma_event].pc == pc) {
			const DmaTransfer &d = trace.dma_transfers[next_dma_event++];
			StringBuilder ss;
			bool reverse = d.flags & DmaTransfer::REVERSE_TRANSFER;
			int num_bytes = d.transfer_bytes == 0 ? 0x10000 : d.transfer_bytes;
			assert(d.b_address == 0x80); // So we can detect that we've enabled more and can improve
			ss.format("dma-event $%02X:%04X %s $%02X:%04X (via $2180), $%X/%d bytes%s%s", d.a_bank, d.a_address, reverse ? "<-" : "->", d.wram>>16, d.wram&0xFFFF, num_bytes, num_bytes, d.flags & DmaTransfer::A_ADDRESS_DECREMENT ?" (decrease A)":"", d.flags & DmaTransfer::A_ADDRESS_FIXED ? " (A fixed)":"");
			writer.writeComment(pc, ss.c_str(), 0, 10);
		}
	}
}